

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.c
# Opt level: O0

sds sdsjoin(char **argv,int argc,char *sep)

{
  int local_2c;
  sds pcStack_28;
  int j;
  sds join;
  char *sep_local;
  int argc_local;
  char **argv_local;
  
  pcStack_28 = sdsempty();
  for (local_2c = 0; local_2c < argc; local_2c = local_2c + 1) {
    pcStack_28 = sdscat(pcStack_28,argv[local_2c]);
    if (local_2c != argc + -1) {
      pcStack_28 = sdscat(pcStack_28,sep);
    }
  }
  return pcStack_28;
}

Assistant:

sds sdsjoin(char **argv, int argc, char *sep) {
    sds join = sdsempty();
    int j;

    for (j = 0; j < argc; j++) {
        join = sdscat(join, argv[j]);
        if (j != argc-1) join = sdscat(join,sep);
    }
    return join;
}